

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_to_local_pass.cpp
# Opt level: O0

Status __thiscall spvtools::opt::PrivateToLocalPass::Process(PrivateToLocalPass *this)

{
  __node_base_ptr *this_00;
  uint uVar1;
  bool bVar2;
  bool bVar3;
  Op OVar4;
  uint32_t uVar5;
  IRContext *pIVar6;
  FeatureManager *this_01;
  reference ppVar7;
  Module *this_02;
  size_type sVar8;
  Operand *__x;
  size_type sVar9;
  value_type *__x_00;
  uint32_t local_150;
  uint local_14c;
  undefined1 local_148 [4];
  uint32_t i;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> new_operands;
  Instruction *entry;
  iterator __end3;
  iterator __begin3;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range3;
  undefined1 local_f0 [16];
  pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*> p;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>_>_>
  *__range2_1;
  pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*> local_b8;
  Function *local_a8;
  Function *target_function;
  Instruction *inst;
  iterator __end2;
  iterator __begin2;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  localized_variables;
  vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>_>_>
  variables_to_move;
  bool modified;
  PrivateToLocalPass *this_local;
  
  pIVar6 = Pass::context(&this->super_Pass);
  this_01 = IRContext::get_feature_mgr(pIVar6);
  bVar2 = FeatureManager::HasCapability(this_01,Addresses);
  if (bVar2) {
    this_local._4_4_ = SuccessWithoutChange;
  }
  else {
    std::
    vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>_>_>
    ::vector((vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>_>_>
              *)&localized_variables._M_h._M_single_bucket);
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&__range2);
    Pass::context(&this->super_Pass);
    IRContext::types_values((IRContext *)&__begin2);
    IteratorRange<spvtools::opt::InstructionList::iterator>::begin
              ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2);
    IteratorRange<spvtools::opt::InstructionList::iterator>::end
              ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&inst);
    while (bVar2 = utils::operator!=(&__end2.super_iterator,
                                     (iterator_template<spvtools::opt::Instruction> *)&inst), bVar2)
    {
      target_function =
           (Function *)
           utils::IntrusiveList<spvtools::opt::Instruction>::
           iterator_template<spvtools::opt::Instruction>::operator*(&__end2.super_iterator);
      OVar4 = opt::Instruction::opcode((Instruction *)target_function);
      if (((OVar4 == OpVariable) &&
          (uVar5 = opt::Instruction::GetSingleWordInOperand((Instruction *)target_function,0),
          uVar5 == 6)) &&
         (local_a8 = FindLocalFunction(this,(Instruction *)target_function),
         local_a8 != (Function *)0x0)) {
        __range2_1 = (vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>_>_>
                      *)target_function;
        std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>::
        pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*&,_true>
                  (&local_b8,(Instruction **)&__range2_1,&local_a8);
        std::
        vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>_>_>
        ::push_back((vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>_>_>
                     *)&localized_variables._M_h._M_single_bucket,&local_b8);
      }
      InstructionList::iterator::operator++(&__end2);
    }
    bVar2 = std::
            vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>_>_>
            ::empty((vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>_>_>
                     *)&localized_variables._M_h._M_single_bucket);
    this_00 = &localized_variables._M_h._M_single_bucket;
    __end2_1 = std::
               vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>_>_>
               ::begin((vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>_>_>
                        *)this_00);
    p.second = (Function *)
               std::
               vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>_>_>
               ::end((vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>_>_>
                      *)this_00);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>_*,_std::vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>_>_>_>
                               *)&p.second), bVar3) {
      ppVar7 = __gnu_cxx::
               __normal_iterator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>_*,_std::vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>_>_>_>
               ::operator*(&__end2_1);
      local_f0._8_8_ = ppVar7->first;
      p.first = (Instruction *)ppVar7->second;
      bVar3 = MoveVariable(this,(Instruction *)local_f0._8_8_,(Function *)p.first);
      if (!bVar3) {
        this_local._4_4_ = Failure;
        goto LAB_0080f636;
      }
      local_f0._0_4_ = opt::Instruction::result_id((Instruction *)local_f0._8_8_);
      std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::insert((pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)&__range2,
               (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *)local_f0,__x_00);
      __gnu_cxx::
      __normal_iterator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>_*,_std::vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>_>_>_>
      ::operator++(&__end2_1);
    }
    this_02 = Pass::get_module(&this->super_Pass);
    uVar5 = Module::version(this_02);
    if (0x103ff < uVar5) {
      Pass::get_module(&this->super_Pass);
      Module::entry_points((Module *)&__begin3);
      IteratorRange<spvtools::opt::InstructionList::iterator>::begin
                ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end3);
      IteratorRange<spvtools::opt::InstructionList::iterator>::end
                ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&entry);
      while (bVar3 = utils::operator!=(&__end3.super_iterator,
                                       (iterator_template<spvtools::opt::Instruction> *)&entry),
            bVar3) {
        new_operands.
        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)utils::IntrusiveList<spvtools::opt::Instruction>::
                      iterator_template<spvtools::opt::Instruction>::operator*
                                (&__end3.super_iterator);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   local_148);
        for (local_14c = 0; uVar1 = local_14c,
            uVar5 = opt::Instruction::NumInOperands
                              ((Instruction *)
                               new_operands.
                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage), uVar1 < uVar5;
            local_14c = local_14c + 1) {
          bVar3 = true;
          if (2 < local_14c) {
            local_150 = opt::Instruction::GetSingleWordInOperand
                                  ((Instruction *)
                                   new_operands.
                                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,local_14c);
            sVar8 = std::
                    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)&__range2,&local_150);
            bVar3 = sVar8 == 0;
          }
          if (bVar3) {
            __x = opt::Instruction::GetInOperand
                            ((Instruction *)
                             new_operands.
                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,local_14c);
            std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                      ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                       local_148,__x);
          }
        }
        sVar9 = std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::size
                          ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            *)local_148);
        uVar5 = opt::Instruction::NumInOperands
                          ((Instruction *)
                           new_operands.
                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (sVar9 != uVar5) {
          opt::Instruction::SetInOperands
                    ((Instruction *)
                     new_operands.
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,(OperandList *)local_148);
          pIVar6 = Pass::context(&this->super_Pass);
          IRContext::AnalyzeUses
                    (pIVar6,(Instruction *)
                            new_operands.
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   local_148);
        InstructionList::iterator::operator++(&__end3);
      }
    }
    this_local._4_4_ = SuccessWithoutChange;
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      this_local._4_4_ = SuccessWithChange;
    }
LAB_0080f636:
    local_f0._4_4_ = 1;
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)&__range2);
    std::
    vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>_>_>
    ::~vector((vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>_>_>
               *)&localized_variables._M_h._M_single_bucket);
  }
  return this_local._4_4_;
}

Assistant:

Pass::Status PrivateToLocalPass::Process() {
  bool modified = false;

  // Private variables require the shader capability.  If this is not a shader,
  // there is no work to do.
  if (context()->get_feature_mgr()->HasCapability(spv::Capability::Addresses))
    return Status::SuccessWithoutChange;

  std::vector<std::pair<Instruction*, Function*>> variables_to_move;
  std::unordered_set<uint32_t> localized_variables;
  for (auto& inst : context()->types_values()) {
    if (inst.opcode() != spv::Op::OpVariable) {
      continue;
    }

    if (spv::StorageClass(inst.GetSingleWordInOperand(
            kVariableStorageClassInIdx)) != spv::StorageClass::Private) {
      continue;
    }

    Function* target_function = FindLocalFunction(inst);
    if (target_function != nullptr) {
      variables_to_move.push_back({&inst, target_function});
    }
  }

  modified = !variables_to_move.empty();
  for (auto p : variables_to_move) {
    if (!MoveVariable(p.first, p.second)) {
      return Status::Failure;
    }
    localized_variables.insert(p.first->result_id());
  }

  if (get_module()->version() >= SPV_SPIRV_VERSION_WORD(1, 4)) {
    // In SPIR-V 1.4 and later entry points must list private storage class
    // variables that are statically used by the entry point. Go through the
    // entry points and remove any references to variables that were localized.
    for (auto& entry : get_module()->entry_points()) {
      std::vector<Operand> new_operands;
      for (uint32_t i = 0; i < entry.NumInOperands(); ++i) {
        // Execution model, function id and name are always kept.
        if (i < 3 ||
            !localized_variables.count(entry.GetSingleWordInOperand(i))) {
          new_operands.push_back(entry.GetInOperand(i));
        }
      }
      if (new_operands.size() != entry.NumInOperands()) {
        entry.SetInOperands(std::move(new_operands));
        context()->AnalyzeUses(&entry);
      }
    }
  }

  return (modified ? Status::SuccessWithChange : Status::SuccessWithoutChange);
}